

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.h
# Opt level: O1

void __thiscall
miniros::master::RegistrationManager::~RegistrationManager(RegistrationManager *this)

{
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>_>
  ::~_Rb_tree(&(this->param_subscribers).service_api_map._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
               *)&this->param_subscribers);
  ::std::
  _Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  ::~_Rb_tree(&(this->m_nodesToShutdown)._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  ::~_Rb_tree(&(this->m_nodes)._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>_>
  ::~_Rb_tree(&(this->services).service_api_map._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
               *)&this->services);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>_>
  ::~_Rb_tree(&(this->subscribers).service_api_map._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
               *)&this->subscribers);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::master::Registrations::Record>_>_>
  ::~_Rb_tree(&(this->publishers).service_api_map._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
               *)this);
  return;
}

Assistant:

class MINIROS_DECL RegistrationManager {
public:
  using RpcValue = XmlRpc::XmlRpcValue;

  RegistrationManager();

  Registrations publishers;
  Registrations subscribers;
  Registrations services;

  /// Get a list of URIs for specified topic and caller.
  std::vector<std::string> getTopicSubscribersUri(const std::string& topic, const std::string& caller_api);

  /// Get nodes which publish specified topic.
  std::vector<std::shared_ptr<NodeRef>> getTopicPublishers(const std::string& topic) const;

  /// Get nodes which subscribe to specified topic.
  std::vector<std::shared_ptr<NodeRef>> getTopicSubscribers(const std::string& topic) const;

  /// Find node by its name.
  /// @returns reference to a node or nullptr if no node is found.
  std::shared_ptr<NodeRef> getNodeByName(const std::string& nodeName) const;

  /// Find node by an API URI.
  /// @returns reference to a node or nullptr if no node is found.
  std::shared_ptr<NodeRef> getNodeByAPI(const std::string& nodeApi) const;

  /// Register or update node API.
  /// @returns a pair with {newNode, replacedNode}
  std::pair<NodeRefPtr, NodeRefPtr> registerNodeApi(const std::string& caller_id, const std::string& caller_api);

  /// Internal method for registering an object.
  /// It can allocate new NodeRef for an object, or update an existing one.
  /// @param r - a container for registrations
  /// @param key - name of an object being registered
  /// @param caller_id - name of a node
  /// @param caller_api - API of a node
  /// @param service_api - ?
  /// @returns reference to a node.
  std::shared_ptr<NodeRef> _register(Registrations& r, const std::string& key, const std::string& caller_id, const std::string& caller_api,
    const std::string& service_api = "");

  ReturnStruct unregisterObject(Registrations& r, const std::string& key, const std::string& caller_id,
    const std::string& caller_api, const std::string& service_api = "");

  std::shared_ptr<NodeRef> register_service(const std::string& service, const std::string& caller_id, const std::string& caller_api,
    const std::string& service_api);

  std::shared_ptr<NodeRef> register_publisher(const std::string& topic, const std::string& caller_id, const std::string& caller_api);

  std::shared_ptr<NodeRef> register_subscriber(const std::string& topic, const std::string& caller_id, const std::string& caller_api);

  std::shared_ptr<NodeRef> register_param_subscriber(const std::string& param, const std::string& caller_id, const std::string& caller_api);

  ReturnStruct unregister_service(const std::string& service, const std::string& caller_id, const std::string& service_api);

  ReturnStruct unregister_subscriber(const std::string& topic, const std::string& caller_id, const std::string& caller_api);

  ReturnStruct unregister_publisher(const std::string& topic, const std::string& caller_id, const std::string& caller_api);

  ReturnStruct unregister_param_subscriber(const std::string& param, const std::string& caller_id, const std::string& caller_api);

  /// Take collection of nodes for shutdown.
  std::set<std::shared_ptr<NodeRef>> pullShutdownNodes();

  std::ostream& writeJson(std::ostream& os, miniros::JsonState& state, const miniros::JsonSettings& settings) const;

  /// Drop all registrations for specified node.
  void dropRegistrations(const std::shared_ptr<NodeRef>& node);

protected:

  /// Find node by its name.
  /// This version does not lock any mutex.
  /// @returns reference to a node or nullptr if no node is found.
  std::shared_ptr<NodeRef> getNodeByNameUnsafe(const std::string& nodeName) const;

  /// Find node by an API URI.
  /// This version does not lock any mutex.
  /// @returns reference to a node or nullptr if no node is found.
  std::shared_ptr<NodeRef> getNodeByAPIUnsafe(const std::string& nodeApi) const;

protected:
  mutable std::mutex m_guard;

  /// Maps node name/id to a ref.
  std::map<std::string, std::shared_ptr<NodeRef>> m_nodes;

  /// A collection of nodes queued for shutdown.
  std::set<std::shared_ptr<NodeRef>> m_nodesToShutdown;

  Registrations param_subscribers;
}